

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O3

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,
                 monster_conflict *mon)

{
  mon_spell_info *pmVar1;
  char *pcVar2;
  _Bool _Var3;
  _Bool _Var4;
  bool bVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint flag;
  size_t size;
  bitflag *flags_00;
  mon_spell_info *pmVar8;
  int iVar9;
  monster_spell **ppmVar10;
  effect *peVar11;
  timed_failure *ptVar12;
  bitflag backup [13];
  int local_60;
  bitflag local_3d [13];
  
  _Var3 = monster_is_smart((monster *)mon);
  flag_wipe(local_3d,0xd);
  local_60 = 100;
  pmVar8 = mon_spell_types;
  uVar6 = 0;
  do {
    ppmVar10 = &monster_spells;
    do {
      ppmVar10 = &((monster_spell *)ppmVar10)->next->next;
      if ((monster_spell *)ppmVar10 == (monster_spell *)0x0) goto LAB_00183ddb;
    } while (((monster_spell *)ppmVar10)->index != uVar6);
    _Var4 = flag_has_dbg(spells,0xd,(uint)uVar6,"spells","info->index");
    if (_Var4) {
      peVar11 = ((monster_spell *)ppmVar10)->effect;
      if ((pmVar8->type & 7) == 0) {
        for (; peVar11 != (effect *)0x0; peVar11 = peVar11->next) {
          if ((_Var3) || (uVar7 = Rand_div(3), uVar7 != 0)) {
            if (peVar11->index == 10) {
              if (0x34 < (ulong)(uint)peVar11->subtype) {
                __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-spell.c"
                              ,0x205,
                              "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                             );
              }
              ptVar12 = timed_effects[(uint)peVar11->subtype].fail;
LAB_00183cef:
              if (ptVar12 != (timed_failure *)0x0) {
                do {
                  switch(ptVar12->code) {
                  case 1:
                    iVar9 = ptVar12->idx;
                    size = 6;
                    pcVar2 = "save str flags";
                    flags_00 = flags;
                    goto LAB_00183d47;
                  case 2:
                    bVar5 = el[ptVar12->idx].res_level < 0x51;
                    break;
                  case 3:
                    bVar5 = 100 < el[ptVar12->idx].res_level;
                    break;
                  case 4:
                    iVar9 = ptVar12->idx;
                    size = 10;
                    pcVar2 = "p->state.pflags";
                    flags_00 = pflags;
LAB_00183d47:
                    bVar5 = flag_has_dbg(flags_00,size,iVar9,pcVar2 + 9,"f->idx");
                    break;
                  default:
                    goto switchD_00183d0b_default;
                  }
                  ptVar12 = ptVar12->next;
                  if ((ptVar12 == (timed_failure *)0x0) || (bVar5 != false)) {
                    if (bVar5 != false) goto LAB_00183dc9;
                    break;
                  }
                } while( true );
              }
            }
            if (!_Var3) goto LAB_00183d80;
LAB_00183d8e:
            if ((peVar11->index == 0x17) &&
               (_Var4 = flag_has_dbg(pflags,10,0x1d,"pflags","PF_NO_MANA"), _Var4))
            goto LAB_00183dc9;
          }
          else {
LAB_00183d80:
            uVar7 = Rand_div(2);
            if (uVar7 == 0) goto LAB_00183d8e;
          }
        }
      }
      else {
        iVar9 = 100 - el[peVar11->subtype].res_level;
        if (iVar9 <= local_60 && _Var3) {
          flag_on_dbg(local_3d,0xd,(uint)uVar6,"backup","info->index");
          local_60 = iVar9;
        }
        uVar7 = Rand_div(100);
        if ((int)uVar7 < iVar9) {
LAB_00183dc9:
          flag_off(spells,0xd,(uint)uVar6);
        }
      }
    }
LAB_00183ddb:
    uVar6 = pmVar8[1].index;
    pmVar8 = pmVar8 + 1;
  } while (uVar6 < 0x61);
  iVar9 = flag_count(spells,0xd);
  if ((_Var3) && (uVar7 = Rand_div(iVar9 + 1), uVar7 == 0)) {
    pmVar8 = mon_spell_types;
    flag = 0;
    do {
      ppmVar10 = &monster_spells;
      do {
        ppmVar10 = &((monster_spell *)ppmVar10)->next->next;
        if ((monster_spell *)ppmVar10 == (monster_spell *)0x0) goto LAB_00183e97;
      } while (((monster_spell *)ppmVar10)->index != (uint16_t)flag);
      _Var3 = flag_has_dbg(local_3d,0xd,flag,"backup","info->index");
      if ((_Var3) && (100 - el[((monster_spell *)ppmVar10)->effect->subtype].res_level == local_60))
      {
        flag_on_dbg(spells,0xd,flag,"spells","info->index");
      }
LAB_00183e97:
      pmVar1 = pmVar8 + 1;
      flag = (uint)pmVar1->index;
      pmVar8 = pmVar8 + 1;
    } while (pmVar1->index < 0x61);
  }
  return;
switchD_00183d0b_default:
  ptVar12 = ptVar12->next;
  goto LAB_00183cef;
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);
	int lowest_resist = RES_LEVEL_BASE;
	bitflag backup[RSF_SIZE];
	int restore_chance = 0;

	rsf_wipe(backup);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int raw_resist = RES_LEVEL_BASE - el[element].res_level;

			/* Smart monsters keep a backup */
			if (smart && (raw_resist <= lowest_resist)) {
				lowest_resist = raw_resist;
				rsf_on(backup, info->index);
			}

			/* High resist means more likely to drop the spell */
			if (randint0(100) < raw_resist) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level <= RES_LEVEL_EFFECT) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level > RES_LEVEL_BASE) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}

	/* Smart monsters re-assess dropped elemental spells */
	restore_chance = 1 + rsf_count(spells);
	if (smart && one_in_(restore_chance)) {
		for (info = mon_spell_types; info->index < RSF_MAX; info++) {
			const struct monster_spell *spell =
				monster_spell_by_index(info->index);
			int element;
			if (!spell) continue;
			if (!rsf_has(backup, info->index)) continue;
			element = spell->effect->subtype;
			if (RES_LEVEL_BASE - el[element].res_level == lowest_resist) {
				rsf_on(spells, info->index);
			}
		}
	}
}